

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O3

void input_dialog_abort_proc(Am_Object *cmd)

{
  Am_Value *value;
  Am_Object widget_cmd;
  Am_Object widget;
  Am_Object_Method aborter;
  Am_Object text_widget;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object_Method local_30;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Get_Object((Am_Object *)&local_30,(Am_Slot_Key)cmd,10);
  Am_Object::Get_Object(&local_38,(Am_Slot_Key)&local_30,0x68);
  Am_Object::~Am_Object((Am_Object *)&local_30);
  Am_Object::Get_Object((Am_Object *)&local_30,(Am_Slot_Key)&local_38,0x1ec);
  Am_Object::Get_Object(&local_10,(Am_Slot_Key)&local_30,0x1eb);
  Am_Object::~Am_Object((Am_Object *)&local_30);
  Am_Object::Am_Object(&local_18,&local_10);
  Am_Abort_Widget(&local_18);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Get_Object(&local_40,(Am_Slot_Key)&local_38,0xc5);
  value = Am_Object::Get(&local_40,0xc9,0);
  Am_Object_Method::Am_Object_Method(&local_30,value);
  Am_Object::Am_Object(&local_20,&local_40);
  (*local_30.Call)((Am_Object_Data *)&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_10);
  Am_Object::~Am_Object(&local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, input_dialog_abort, (Am_Object cmd))
{
  Am_Object widget = cmd.Get_Owner().Get_Object(Am_WINDOW);
  Am_Object text_widget =
      widget.Get_Object(Am_DIALOG_GROUP).Get_Object(Am_TEXT_WIDGET);
  Am_Abort_Widget(text_widget);
  // explicitly call dialog box's abort method.  We don't have any
  // implementation parent here, because then this stop method would call
  // the dialog's stop method as well as the abort method.
  // Is there a better way?
  Am_Object widget_cmd = widget.Get_Object(Am_COMMAND);
  Am_Object_Method aborter = widget_cmd.Get(Am_ABORT_DO_METHOD);
  aborter.Call(widget_cmd);
}